

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  size_type *psVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  CdnAddCdnDomainRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_289;
  CdnAddCdnDomainResponseType resp;
  string local_268;
  string local_248 [32];
  string local_228 [32];
  string local_208;
  CdnDescribeCdnDomainBaseDetailRequestType req_2;
  CdnAddCdnDomainRequestType req;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar1 = &req.owner_id.field_2;
  req.owner_id._M_string_length = 0;
  req.owner_id.field_2._M_allocated_capacity =
       req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
  paVar2 = &req.resource_owner_account.field_2;
  req.resource_owner_account._M_string_length = 0;
  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
  paVar3 = &req.resource_owner_id.field_2;
  req.resource_owner_id._M_string_length = 0;
  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
  req.domain_name._M_dataplus._M_p = (pointer)&req.domain_name.field_2;
  req.domain_name._M_string_length = 0;
  req.domain_name.field_2._M_local_buf[0] = '\0';
  req.ssl_flag._M_dataplus._M_p = (pointer)&req.ssl_flag.field_2;
  req.ssl_flag._M_string_length = 0;
  req.ssl_flag.field_2._M_local_buf[0] = '\0';
  req.source_type._M_dataplus._M_p = (pointer)&req.source_type.field_2;
  req.source_type._M_string_length = 0;
  req.source_type.field_2._M_local_buf[0] = '\0';
  req.cdn_type._M_dataplus._M_p = (pointer)&req.cdn_type.field_2;
  req.cdn_type._M_string_length = 0;
  req.cdn_type.field_2._M_local_buf[0] = '\0';
  req.sources._M_dataplus._M_p = (pointer)&req.sources.field_2;
  req.sources._M_string_length = 0;
  req.sources.field_2._M_local_buf[0] = '\0';
  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            (local_228,"my_appid",(allocator<char> *)&local_268);
  std::__cxx11::string::string<std::allocator<char>>(local_248,"my_secret",&local_289);
  this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient(&req_2,local_228,local_248);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string((string *)&req_2);
  if (this == (CdnAddCdnDomainRequestType *)0x0) {
    aliyun::CdnAddCdnDomainRequestType::~CdnAddCdnDomainRequestType(&req);
    req.owner_id._M_string_length = 0;
    req.owner_id.field_2._M_allocated_capacity =
         req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
    req.resource_owner_account._M_string_length = 0;
    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
    req.resource_owner_id._M_string_length = 0;
    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
    req.domain_name._M_dataplus._M_p = (pointer)&req.domain_name.field_2;
    req.domain_name._M_string_length = 0;
    req.domain_name.field_2._M_local_buf[0] = '\0';
    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              (local_228,"my_appid",(allocator<char> *)&local_268);
    std::__cxx11::string::string<std::allocator<char>>(local_248,"my_secret",&local_289);
    this = (CdnAddCdnDomainRequestType *)aliyun::Cdn::CreateCdnClient(&req_2,local_228,local_248);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string((string *)&req_2);
    if (this == (CdnAddCdnDomainRequestType *)0x0) {
      aliyun::CdnDeleteCdnDomainRequestType::~CdnDeleteCdnDomainRequestType
                ((CdnDeleteCdnDomainRequestType *)&req);
      req_2.owner_id._M_dataplus._M_p = (pointer)&req_2.owner_id.field_2;
      req_2.owner_id._M_string_length = 0;
      req_2.owner_id.field_2._M_allocated_capacity =
           req_2.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      req_2.resource_owner_account._M_dataplus._M_p = (pointer)&req_2.resource_owner_account.field_2
      ;
      req_2.resource_owner_account._M_string_length = 0;
      req_2.resource_owner_account.field_2._M_local_buf[0] = '\0';
      req_2.resource_owner_id._M_dataplus._M_p = (pointer)&req_2.resource_owner_id.field_2;
      req_2.resource_owner_id._M_string_length = 0;
      req_2.resource_owner_id.field_2._M_local_buf[0] = '\0';
      req_2.domain_name._M_dataplus._M_p = (pointer)&req_2.domain_name.field_2;
      req_2.domain_name._M_string_length = 0;
      req.owner_id._M_dataplus._M_p = (pointer)0x0;
      req.owner_id._M_string_length = 0;
      req.owner_id.field_2._M_allocated_capacity = 0;
      req.owner_id.field_2._8_8_ = &req.resource_owner_account._M_string_length;
      req.resource_owner_account._M_dataplus._M_p = (pointer)0x0;
      req.resource_owner_account._M_string_length =
           req.resource_owner_account._M_string_length & 0xffffffffffffff00;
      req.resource_owner_account.field_2._8_8_ = &req.resource_owner_id._M_string_length;
      req.resource_owner_id._M_dataplus._M_p = (pointer)0x0;
      req.resource_owner_id._M_string_length =
           req.resource_owner_id._M_string_length & 0xffffffffffffff00;
      req.resource_owner_id.field_2._8_8_ = &req.domain_name._M_string_length;
      req.domain_name._M_dataplus._M_p = (pointer)0x0;
      req.domain_name._M_string_length = req.domain_name._M_string_length & 0xffffffffffffff00;
      req.domain_name.field_2._8_8_ = &req.ssl_flag._M_string_length;
      req.ssl_flag._M_dataplus._M_p = (pointer)0x0;
      req.ssl_flag._M_string_length = req.ssl_flag._M_string_length & 0xffffffffffffff00;
      psVar4 = &req.source_type._M_string_length;
      req.source_type._M_dataplus._M_p = (pointer)0x0;
      req.source_type._M_string_length = req.source_type._M_string_length & 0xffffffffffffff00;
      psVar5 = &req.cdn_type._M_string_length;
      req.cdn_type._M_dataplus._M_p = (pointer)0x0;
      req.cdn_type._M_string_length = req.cdn_type._M_string_length & 0xffffffffffffff00;
      psVar6 = &req.sources._M_string_length;
      req.sources._M_dataplus._M_p = (pointer)0x0;
      req_2.domain_name.field_2._M_local_buf[0] = '\0';
      req.sources._M_string_length = req.sources._M_string_length & 0xffffffffffffff00;
      local_60._M_local_buf[0] = '\0';
      req.ssl_flag.field_2._8_8_ = psVar4;
      req.source_type.field_2._8_8_ = psVar5;
      req.cdn_type.field_2._8_8_ = psVar6;
      req.sources.field_2._8_8_ = &local_60;
      std::__cxx11::string::string<std::allocator<char>>
                (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
      std::__cxx11::string::string<std::allocator<char>>
                (local_248,"my_appid",(allocator<char> *)&resp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"my_secret",&local_289);
      this = (CdnAddCdnDomainRequestType *)
             aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_228);
      if (this == (CdnAddCdnDomainRequestType *)0x0) {
        aliyun::CdnDescribeCdnDomainBaseDetailDomainBaseDetailModelType::
        ~CdnDescribeCdnDomainBaseDetailDomainBaseDetailModelType
                  ((CdnDescribeCdnDomainBaseDetailDomainBaseDetailModelType *)&req);
        aliyun::CdnDescribeCdnDomainBaseDetailRequestType::
        ~CdnDescribeCdnDomainBaseDetailRequestType(&req_2);
        req_2.owner_id._M_dataplus._M_p = (pointer)&req_2.owner_id.field_2;
        req_2.owner_id._M_string_length = 0;
        req_2.owner_id.field_2._M_allocated_capacity =
             req_2.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
        req_2.resource_owner_account._M_dataplus._M_p =
             (pointer)&req_2.resource_owner_account.field_2;
        req_2.resource_owner_account._M_string_length = 0;
        req_2.resource_owner_account.field_2._M_local_buf[0] = '\0';
        req_2.resource_owner_id._M_dataplus._M_p = (pointer)&req_2.resource_owner_id.field_2;
        req_2.resource_owner_id._M_string_length = 0;
        req_2.resource_owner_id.field_2._M_local_buf[0] = '\0';
        req_2.domain_name._M_dataplus._M_p = (pointer)&req_2.domain_name.field_2;
        req_2.domain_name._M_string_length = 0;
        req.owner_id._M_dataplus._M_p = (pointer)0x0;
        req.owner_id._M_string_length = 0;
        req.owner_id.field_2._M_allocated_capacity = 0;
        req.owner_id.field_2._8_8_ = &req.resource_owner_account._M_string_length;
        req.resource_owner_account._M_dataplus._M_p = (pointer)0x0;
        req.resource_owner_account._M_string_length =
             req.resource_owner_account._M_string_length & 0xffffffffffffff00;
        req.resource_owner_account.field_2._8_8_ = &req.resource_owner_id._M_string_length;
        req.resource_owner_id._M_dataplus._M_p = (pointer)0x0;
        req.resource_owner_id._M_string_length =
             req.resource_owner_id._M_string_length & 0xffffffffffffff00;
        req.resource_owner_id.field_2._8_8_ = &req.domain_name._M_string_length;
        req.domain_name._M_dataplus._M_p = (pointer)0x0;
        req.domain_name._M_string_length = req.domain_name._M_string_length & 0xffffffffffffff00;
        req.domain_name.field_2._8_8_ = &req.ssl_flag._M_string_length;
        req.ssl_flag._M_dataplus._M_p = (pointer)0x0;
        req.ssl_flag._M_string_length = req.ssl_flag._M_string_length & 0xffffffffffffff00;
        req.source_type._M_dataplus._M_p = (pointer)0x0;
        req.source_type._M_string_length = req.source_type._M_string_length & 0xffffffffffffff00;
        req.cdn_type._M_dataplus._M_p = (pointer)0x0;
        req.cdn_type._M_string_length = req.cdn_type._M_string_length & 0xffffffffffffff00;
        req.sources._M_dataplus._M_p = (pointer)0x0;
        req.sources._M_string_length = req.sources._M_string_length & 0xffffffffffffff00;
        req_2.domain_name.field_2._M_local_buf[0] = '\0';
        local_60._M_local_buf[0] = '\0';
        local_50._M_p = (pointer)&local_40;
        local_48 = 0;
        local_40._M_local_buf[0] = '\0';
        req.ssl_flag.field_2._8_8_ = psVar4;
        req.source_type.field_2._8_8_ = psVar5;
        req.cdn_type.field_2._8_8_ = psVar6;
        req.sources.field_2._8_8_ = &local_60;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_248,"my_appid",(allocator<char> *)&resp);
        paVar1 = &req.owner_id.field_2;
        paVar2 = &req.resource_owner_account.field_2;
        paVar3 = &req.resource_owner_id.field_2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"my_secret",&local_289);
        this = (CdnAddCdnDomainRequestType *)
               aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_228);
        if (this == (CdnAddCdnDomainRequestType *)0x0) {
          aliyun::CdnDescribeCdnDomainDetailGetDomainDetailModelType::
          ~CdnDescribeCdnDomainDetailGetDomainDetailModelType
                    ((CdnDescribeCdnDomainDetailGetDomainDetailModelType *)&req);
          aliyun::CdnDescribeCdnDomainDetailRequestType::~CdnDescribeCdnDomainDetailRequestType
                    ((CdnDescribeCdnDomainDetailRequestType *)&req_2);
          req.owner_id._M_string_length = 0;
          req.owner_id.field_2._M_allocated_capacity =
               req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
          req.resource_owner_account._M_string_length = 0;
          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
          req.resource_owner_id._M_string_length = 0;
          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
          req.domain_name._M_string_length = 0;
          req.domain_name.field_2._M_local_buf[0] = '\0';
          req.ssl_flag._M_dataplus._M_p = (pointer)&req.ssl_flag.field_2;
          req.ssl_flag._M_string_length = 0;
          req.ssl_flag.field_2._M_local_buf[0] = '\0';
          req_2.owner_id.field_2._M_allocated_capacity = 0;
          req_2.owner_id._M_dataplus._M_p = (pointer)0x0;
          req_2.owner_id._M_string_length = 0;
          psVar4 = &req_2.resource_owner_account._M_string_length;
          req_2.resource_owner_account._M_dataplus._M_p = (pointer)0x0;
          req_2.resource_owner_account._M_string_length =
               req_2.resource_owner_account._M_string_length & 0xffffffffffffff00;
          req_2.owner_id.field_2._8_8_ = psVar4;
          req.owner_id._M_dataplus._M_p = (pointer)paVar1;
          req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
          req.domain_name._M_dataplus._M_p = (pointer)&req.domain_name.field_2;
          std::__cxx11::string::string<std::allocator<char>>
                    (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_248,"my_appid",(allocator<char> *)&resp);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"my_secret",&local_289);
          this = (CdnAddCdnDomainRequestType *)
                 aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string(local_248);
          std::__cxx11::string::~string(local_228);
          if (this == (CdnAddCdnDomainRequestType *)0x0) {
            aliyun::CdnDescribeCdnDomainLogsDomainLogModelType::
            ~CdnDescribeCdnDomainLogsDomainLogModelType
                      ((CdnDescribeCdnDomainLogsDomainLogModelType *)&req_2);
            aliyun::CdnDescribeCdnDomainLogsRequestType::~CdnDescribeCdnDomainLogsRequestType
                      ((CdnDescribeCdnDomainLogsRequestType *)&req);
            req.owner_id._M_string_length = 0;
            req.owner_id.field_2._M_allocated_capacity =
                 req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
            req.resource_owner_account._M_string_length = 0;
            req.resource_owner_account.field_2._M_local_buf[0] = '\0';
            req.resource_owner_id._M_string_length = 0;
            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
            req.domain_name._M_dataplus._M_p = (pointer)&req.domain_name.field_2;
            req.domain_name._M_string_length = 0;
            req.domain_name.field_2._M_local_buf[0] = '\0';
            req.ssl_flag._M_dataplus._M_p = (pointer)&req.ssl_flag.field_2;
            req.ssl_flag._M_string_length = 0;
            req.ssl_flag.field_2._M_local_buf[0] = '\0';
            req.source_type._M_dataplus._M_p = (pointer)&req.source_type.field_2;
            req.source_type._M_string_length = 0;
            req_2.owner_id._M_dataplus._M_p = (pointer)0x0;
            req_2.owner_id._M_string_length = 0;
            req_2.owner_id.field_2._M_allocated_capacity = 0;
            req_2.resource_owner_account._M_dataplus._M_p = (pointer)0x0;
            req_2.resource_owner_account._M_string_length =
                 req_2.resource_owner_account._M_string_length & 0xffffffffffffff00;
            req_2.resource_owner_id._M_dataplus._M_p = (pointer)&req_2.resource_owner_id.field_2;
            req_2.resource_owner_id._M_string_length = 0;
            req.source_type.field_2._M_local_buf[0] = '\0';
            req_2.resource_owner_id.field_2._M_local_buf[0] = '\0';
            req_2.domain_name._M_dataplus._M_p = (pointer)&req_2.domain_name.field_2;
            req_2.domain_name._M_string_length = 0;
            req_2.domain_name.field_2._M_local_buf[0] = '\0';
            req_2.owner_id.field_2._8_8_ = psVar4;
            req.owner_id._M_dataplus._M_p = (pointer)paVar1;
            req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
            req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::string<std::allocator<char>>
                      (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_248,"my_appid",(allocator<char> *)&resp);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,"my_secret",&local_289);
            paVar7 = &req.domain_name.field_2;
            this = (CdnAddCdnDomainRequestType *)
                   aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string(local_248);
            std::__cxx11::string::~string(local_228);
            if (this == (CdnAddCdnDomainRequestType *)0x0) {
              aliyun::CdnDescribeCdnMonitorDataResponseType::~CdnDescribeCdnMonitorDataResponseType
                        ((CdnDescribeCdnMonitorDataResponseType *)&req_2);
              aliyun::CdnDescribeCdnMonitorDataRequestType::~CdnDescribeCdnMonitorDataRequestType
                        ((CdnDescribeCdnMonitorDataRequestType *)&req);
              req_2.owner_id._M_dataplus._M_p = (pointer)&req_2.owner_id.field_2;
              req_2.owner_id._M_string_length = 0;
              req_2.owner_id.field_2._M_allocated_capacity =
                   req_2.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
              req_2.resource_owner_account._M_dataplus._M_p =
                   (pointer)&req_2.resource_owner_account.field_2;
              req_2.resource_owner_account._M_string_length = 0;
              req_2.resource_owner_account.field_2._M_local_buf[0] = '\0';
              req_2.resource_owner_id._M_dataplus._M_p = (pointer)&req_2.resource_owner_id.field_2;
              req_2.resource_owner_id._M_string_length = 0;
              req.owner_id._M_dataplus._M_p = (pointer)0x0;
              req.owner_id._M_string_length = 0;
              req.owner_id.field_2._M_allocated_capacity = 0;
              req.owner_id.field_2._8_8_ = &req.resource_owner_account._M_string_length;
              req.resource_owner_account._M_dataplus._M_p = (pointer)0x0;
              req.resource_owner_account._M_string_length =
                   req.resource_owner_account._M_string_length & 0xffffffffffffff00;
              req.resource_owner_account.field_2._8_8_ = &req.resource_owner_id._M_string_length;
              req.resource_owner_id._M_dataplus._M_p = (pointer)0x0;
              req.resource_owner_id._M_string_length =
                   req.resource_owner_id._M_string_length & 0xffffffffffffff00;
              req.resource_owner_id.field_2._8_8_ = &req.domain_name._M_string_length;
              req.domain_name._M_dataplus._M_p = (pointer)0x0;
              req_2.resource_owner_id.field_2._M_local_buf[0] = '\0';
              req.domain_name._M_string_length =
                   req.domain_name._M_string_length & 0xffffffffffffff00;
              req.domain_name.field_2._8_8_ = &req.ssl_flag._M_string_length;
              req.ssl_flag._M_dataplus._M_p = (pointer)0x0;
              req.ssl_flag._M_string_length = req.ssl_flag._M_string_length & 0xffffffffffffff00;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_248,"my_appid",(allocator<char> *)&resp);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_208,"my_secret",&local_289);
              this = (CdnAddCdnDomainRequestType *)
                     aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
              std::__cxx11::string::~string((string *)&local_208);
              std::__cxx11::string::~string(local_248);
              std::__cxx11::string::~string(local_228);
              if (this == (CdnAddCdnDomainRequestType *)0x0) {
                aliyun::CdnDescribeCdnServiceResponseType::~CdnDescribeCdnServiceResponseType
                          ((CdnDescribeCdnServiceResponseType *)&req);
                aliyun::CdnDescribeCdnServiceRequestType::~CdnDescribeCdnServiceRequestType
                          ((CdnDescribeCdnServiceRequestType *)&req_2);
                req.owner_id._M_string_length = 0;
                req.owner_id.field_2._M_allocated_capacity =
                     req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req.resource_owner_account._M_string_length = 0;
                req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                req.resource_owner_id._M_string_length = 0;
                req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                req.domain_name._M_string_length = 0;
                req.domain_name.field_2._M_local_buf[0] = '\0';
                req.ssl_flag._M_dataplus._M_p = (pointer)&req.ssl_flag.field_2;
                req.ssl_flag._M_string_length = 0;
                req_2.owner_id._M_dataplus._M_p = (pointer)&req_2.owner_id.field_2;
                req_2.owner_id._M_string_length = 0;
                req.ssl_flag.field_2._M_local_buf[0] = '\0';
                req_2.owner_id.field_2._M_allocated_capacity =
                     req_2.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                req_2.resource_owner_account._M_dataplus._M_p =
                     (pointer)&req_2.resource_owner_account.field_2;
                req_2.resource_owner_account._M_string_length = 0;
                req_2.resource_owner_account.field_2._M_local_buf[0] = '\0';
                req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_248,"my_appid",(allocator<char> *)&resp);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_208,"my_secret",&local_289);
                this = (CdnAddCdnDomainRequestType *)
                       aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
                std::__cxx11::string::~string((string *)&local_208);
                std::__cxx11::string::~string(local_248);
                std::__cxx11::string::~string(local_228);
                if (this == (CdnAddCdnDomainRequestType *)0x0) {
                  aliyun::CdnDescribeOneMinuteDataResponseType::
                  ~CdnDescribeOneMinuteDataResponseType
                            ((CdnDescribeOneMinuteDataResponseType *)&req_2);
                  aliyun::CdnDescribeOneMinuteDataRequestType::~CdnDescribeOneMinuteDataRequestType
                            ((CdnDescribeOneMinuteDataRequestType *)&req);
                  req.owner_id._M_string_length = 0;
                  req.owner_id.field_2._M_allocated_capacity =
                       req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  req.resource_owner_account._M_string_length = 0;
                  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                  req.resource_owner_id._M_string_length = 0;
                  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                  req.domain_name._M_string_length = 0;
                  req.domain_name.field_2._M_local_buf[0] = '\0';
                  req.ssl_flag._M_dataplus._M_p = (pointer)&req.ssl_flag.field_2;
                  req.ssl_flag._M_string_length = 0;
                  req.ssl_flag.field_2._M_local_buf[0] = '\0';
                  req.source_type._M_dataplus._M_p = (pointer)&req.source_type.field_2;
                  req.source_type._M_string_length = 0;
                  req.source_type.field_2._M_local_buf[0] = '\0';
                  req.cdn_type._M_dataplus._M_p = (pointer)&req.cdn_type.field_2;
                  req.cdn_type._M_string_length = 0;
                  req.cdn_type.field_2._M_local_buf[0] = '\0';
                  req_2.owner_id._M_dataplus._M_p = (pointer)0x0;
                  req_2.owner_id._M_string_length = 0;
                  req_2.owner_id.field_2._M_allocated_capacity = 0;
                  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                  req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_248,"my_appid",(allocator<char> *)&resp);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_208,"my_secret",&local_289);
                  this = (CdnAddCdnDomainRequestType *)
                         aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
                  std::__cxx11::string::~string((string *)&local_208);
                  std::__cxx11::string::~string(local_248);
                  std::__cxx11::string::~string(local_228);
                  if (this == (CdnAddCdnDomainRequestType *)0x0) {
                    std::
                    vector<aliyun::CdnDescribeRefreshTasksCDNTaskType,_std::allocator<aliyun::CdnDescribeRefreshTasksCDNTaskType>_>
                    ::~vector((vector<aliyun::CdnDescribeRefreshTasksCDNTaskType,_std::allocator<aliyun::CdnDescribeRefreshTasksCDNTaskType>_>
                               *)&req_2);
                    aliyun::CdnDescribeRefreshTasksRequestType::~CdnDescribeRefreshTasksRequestType
                              ((CdnDescribeRefreshTasksRequestType *)&req);
                    req.owner_id._M_string_length = 0;
                    req.owner_id.field_2._M_allocated_capacity =
                         req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    req.resource_owner_account._M_string_length = 0;
                    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                    req.resource_owner_id._M_string_length = 0;
                    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                    req.domain_name._M_string_length = 0;
                    req.domain_name.field_2._M_local_buf[0] = '\0';
                    req.ssl_flag._M_dataplus._M_p = (pointer)&req.ssl_flag.field_2;
                    req.ssl_flag._M_string_length = 0;
                    req.ssl_flag.field_2._M_local_buf[0] = '\0';
                    req_2.owner_id._M_dataplus._M_p = (pointer)0x0;
                    req_2.owner_id._M_string_length = 0;
                    req_2.owner_id.field_2._M_allocated_capacity = 0;
                    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                    req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_248,"my_appid",(allocator<char> *)&resp);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_208,"my_secret",&local_289);
                    this = (CdnAddCdnDomainRequestType *)
                           aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
                    std::__cxx11::string::~string((string *)&local_208);
                    std::__cxx11::string::~string(local_248);
                    std::__cxx11::string::~string(local_228);
                    if (this == (CdnAddCdnDomainRequestType *)0x0) {
                      std::
                      vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
                      ::~vector((vector<aliyun::CdnDescribeUserDomainsPageDataType,_std::allocator<aliyun::CdnDescribeUserDomainsPageDataType>_>
                                 *)&req_2);
                      aliyun::CdnDescribeUserDomainsRequestType::~CdnDescribeUserDomainsRequestType
                                ((CdnDescribeUserDomainsRequestType *)&req);
                      req.owner_id._M_string_length = 0;
                      req.owner_id.field_2._M_allocated_capacity =
                           req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req.resource_owner_account._M_string_length = 0;
                      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                      req.resource_owner_id._M_string_length = 0;
                      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                      req.domain_name._M_string_length = 0;
                      req.domain_name.field_2._M_local_buf[0] = '\0';
                      req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                      req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_208);
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_228,"my_appid",(allocator<char> *)&local_268);
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_248,"my_secret",&local_289);
                      this = (CdnAddCdnDomainRequestType *)
                             aliyun::Cdn::CreateCdnClient(&req_2,local_228,local_248);
                      std::__cxx11::string::~string(local_248);
                      std::__cxx11::string::~string(local_228);
                      std::__cxx11::string::~string((string *)&req_2);
                      if (this == (CdnAddCdnDomainRequestType *)0x0) {
                        aliyun::CdnModifyCdnServiceRequestType::~CdnModifyCdnServiceRequestType
                                  ((CdnModifyCdnServiceRequestType *)&req);
                        req.owner_id._M_string_length = 0;
                        req.owner_id.field_2._M_allocated_capacity =
                             req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        req.resource_owner_account._M_string_length = 0;
                        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                        req.resource_owner_id._M_string_length = 0;
                        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                        req.domain_name._M_string_length = 0;
                        req.domain_name.field_2._M_local_buf[0] = '\0';
                        req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                        req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                        req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&req_2,"cn-hangzhou",(allocator<char> *)&local_208);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_228,"my_appid",(allocator<char> *)&local_268);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_248,"my_secret",&local_289);
                        this = (CdnAddCdnDomainRequestType *)
                               aliyun::Cdn::CreateCdnClient(&req_2,local_228,local_248);
                        std::__cxx11::string::~string(local_248);
                        std::__cxx11::string::~string(local_228);
                        std::__cxx11::string::~string((string *)&req_2);
                        if (this == (CdnAddCdnDomainRequestType *)0x0) {
                          aliyun::CdnOpenCdnServiceRequestType::~CdnOpenCdnServiceRequestType
                                    ((CdnOpenCdnServiceRequestType *)&req);
                          req.owner_id._M_string_length = 0;
                          req.owner_id.field_2._M_allocated_capacity =
                               req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          req.resource_owner_account._M_string_length = 0;
                          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                          req.resource_owner_id._M_string_length = 0;
                          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                          req.domain_name._M_string_length = 0;
                          req.domain_name.field_2._M_local_buf[0] = '\0';
                          req_2.owner_id._M_dataplus._M_p = (pointer)&req_2.owner_id.field_2;
                          req_2.owner_id._M_string_length = 0;
                          req_2.owner_id.field_2._M_allocated_capacity =
                               req_2.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                          req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                          req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_248,"my_appid",(allocator<char> *)&resp);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_208,"my_secret",&local_289);
                          this = (CdnAddCdnDomainRequestType *)
                                 aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
                          std::__cxx11::string::~string((string *)&local_208);
                          std::__cxx11::string::~string(local_248);
                          std::__cxx11::string::~string(local_228);
                          if (this == (CdnAddCdnDomainRequestType *)0x0) {
                            std::__cxx11::string::~string((string *)&req_2);
                            aliyun::CdnPushObjectCacheRequestType::~CdnPushObjectCacheRequestType
                                      ((CdnPushObjectCacheRequestType *)&req);
                            req.owner_id._M_string_length = 0;
                            req.owner_id.field_2._M_allocated_capacity =
                                 req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            req.resource_owner_account._M_string_length = 0;
                            req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                            req.resource_owner_id._M_string_length = 0;
                            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                            req.domain_name._M_string_length = 0;
                            req.domain_name.field_2._M_local_buf[0] = '\0';
                            req.ssl_flag._M_dataplus._M_p = (pointer)&req.ssl_flag.field_2;
                            req.ssl_flag._M_string_length = 0;
                            req.ssl_flag.field_2._M_local_buf[0] = '\0';
                            req_2.owner_id._M_dataplus._M_p = (pointer)&req_2.owner_id.field_2;
                            req_2.owner_id._M_string_length = 0;
                            req_2.owner_id.field_2._M_allocated_capacity =
                                 req_2.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                            req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                            req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                            req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_228,"cn-hangzhou",(allocator<char> *)&local_268);
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_248,"my_appid",(allocator<char> *)&resp);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_208,"my_secret",&local_289);
                            this = (CdnAddCdnDomainRequestType *)
                                   aliyun::Cdn::CreateCdnClient(local_228,local_248,&local_208);
                            std::__cxx11::string::~string((string *)&local_208);
                            std::__cxx11::string::~string(local_248);
                            std::__cxx11::string::~string(local_228);
                            if (this == (CdnAddCdnDomainRequestType *)0x0) {
                              std::__cxx11::string::~string((string *)&req_2);
                              aliyun::CdnRefreshObjectCachesRequestType::
                              ~CdnRefreshObjectCachesRequestType
                                        ((CdnRefreshObjectCachesRequestType *)&req);
                              req.owner_id._M_string_length = 0;
                              req.owner_id.field_2._M_allocated_capacity =
                                   req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                              req.resource_owner_account._M_string_length = 0;
                              req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                              req.resource_owner_id._M_string_length = 0;
                              req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                              req.domain_name._M_string_length = 0;
                              req.domain_name.field_2._M_local_buf[0] = '\0';
                              req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                              req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                              req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                              req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&req_2,"cn-hangzhou",
                                         (allocator<char> *)&local_208);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_228,"my_appid",(allocator<char> *)&local_268);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_248,"my_secret",&local_289);
                              this = (CdnAddCdnDomainRequestType *)
                                     aliyun::Cdn::CreateCdnClient(&req_2,local_228,local_248);
                              std::__cxx11::string::~string(local_248);
                              std::__cxx11::string::~string(local_228);
                              std::__cxx11::string::~string((string *)&req_2);
                              if (this == (CdnAddCdnDomainRequestType *)0x0) {
                                aliyun::CdnStartCdnDomainRequestType::~CdnStartCdnDomainRequestType
                                          ((CdnStartCdnDomainRequestType *)&req);
                                req.owner_id._M_string_length = 0;
                                req.owner_id.field_2._M_allocated_capacity =
                                     req.owner_id.field_2._M_allocated_capacity & 0xffffffffffffff00
                                ;
                                req.resource_owner_account._M_string_length = 0;
                                req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                req.resource_owner_id._M_string_length = 0;
                                req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                req.domain_name._M_string_length = 0;
                                req.domain_name.field_2._M_local_buf[0] = '\0';
                                req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                req.domain_name._M_dataplus._M_p = (pointer)paVar7;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&req_2,"cn-hangzhou",
                                           (allocator<char> *)&local_208);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_228,"my_appid",(allocator<char> *)&local_268);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_248,"my_secret",&local_289);
                                this = (CdnAddCdnDomainRequestType *)
                                       aliyun::Cdn::CreateCdnClient(&req_2,local_228,local_248);
                                std::__cxx11::string::~string(local_248);
                                std::__cxx11::string::~string(local_228);
                                std::__cxx11::string::~string((string *)&req_2);
                                if (this == (CdnAddCdnDomainRequestType *)0x0) {
                                  aliyun::CdnStopCdnDomainRequestType::~CdnStopCdnDomainRequestType
                                            ((CdnStopCdnDomainRequestType *)&req);
                                  return 0;
                                }
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_208,"127.0.0.1:12234",
                                           (allocator<char> *)&local_268);
                                aliyun::Cdn::SetProxyHost((Cdn *)this,&local_208);
                                std::__cxx11::string::~string((string *)&local_208);
                                if ((char)(this->resource_owner_account)._M_string_length == '\x01')
                                {
                                  *(undefined1 *)
                                   ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                                }
                                this_00 = (HttpTestListener *)operator_new(0x180);
                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_268,"{}",&local_289);
                                HttpTestListener::SetResponseBody(this_00,&local_268);
                                std::__cxx11::string::~string((string *)&local_268);
                                HttpTestListener::Start(this_00);
                                std::__cxx11::string::assign((char *)&req);
                                std::__cxx11::string::assign((char *)&req.resource_owner_account);
                                std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                std::__cxx11::string::assign((char *)&req.domain_name);
                                aliyun::Cdn::StopCdnDomain
                                          ((CdnStopCdnDomainRequestType *)this,
                                           (CdnStopCdnDomainResponseType *)&req,
                                           (CdnErrorInfo *)&resp);
                                HttpTestListener::WaitComplete(this_00);
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_208,"127.0.0.1:12234",
                                           (allocator<char> *)&local_268);
                                aliyun::Cdn::SetProxyHost((Cdn *)this,&local_208);
                                std::__cxx11::string::~string((string *)&local_208);
                                if ((char)(this->resource_owner_account)._M_string_length == '\x01')
                                {
                                  *(undefined1 *)
                                   ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                                }
                                this_00 = (HttpTestListener *)operator_new(0x180);
                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_268,"{}",&local_289);
                                HttpTestListener::SetResponseBody(this_00,&local_268);
                                std::__cxx11::string::~string((string *)&local_268);
                                HttpTestListener::Start(this_00);
                                std::__cxx11::string::assign((char *)&req);
                                std::__cxx11::string::assign((char *)&req.resource_owner_account);
                                std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                std::__cxx11::string::assign((char *)&req.domain_name);
                                aliyun::Cdn::StartCdnDomain
                                          ((CdnStartCdnDomainRequestType *)this,
                                           (CdnStartCdnDomainResponseType *)&req,
                                           (CdnErrorInfo *)&resp);
                                HttpTestListener::WaitComplete(this_00);
                              }
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_268,"127.0.0.1:12234",
                                         (allocator<char> *)&resp);
                              aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
                              std::__cxx11::string::~string((string *)&local_268);
                              if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                                *(undefined1 *)
                                 ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                              }
                              this_00 = (HttpTestListener *)operator_new(0x180);
                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&resp,"{  \"RefreshTaskId\": \"RefreshTaskId\"}",
                                         &local_289);
                              HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                              std::__cxx11::string::~string((string *)&resp);
                              HttpTestListener::Start(this_00);
                              std::__cxx11::string::assign((char *)&req);
                              std::__cxx11::string::assign((char *)&req.resource_owner_account);
                              std::__cxx11::string::assign((char *)&req.resource_owner_id);
                              std::__cxx11::string::assign((char *)&req.domain_name);
                              std::__cxx11::string::assign((char *)&req.ssl_flag);
                              aliyun::Cdn::RefreshObjectCaches
                                        ((CdnRefreshObjectCachesRequestType *)this,
                                         (CdnRefreshObjectCachesResponseType *)&req,
                                         (CdnErrorInfo *)&req_2);
                              HttpTestListener::WaitComplete(this_00);
                            }
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_268,"127.0.0.1:12234",
                                       (allocator<char> *)&resp);
                            aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
                            std::__cxx11::string::~string((string *)&local_268);
                            if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                              *(undefined1 *)
                               ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                            }
                            this_00 = (HttpTestListener *)operator_new(0x180);
                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&resp,"{  \"PushTaskId\": \"PushTaskId\"}",
                                       &local_289);
                            HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                            std::__cxx11::string::~string((string *)&resp);
                            HttpTestListener::Start(this_00);
                            std::__cxx11::string::assign((char *)&req);
                            std::__cxx11::string::assign((char *)&req.resource_owner_account);
                            std::__cxx11::string::assign((char *)&req.resource_owner_id);
                            std::__cxx11::string::assign((char *)&req.domain_name);
                            aliyun::Cdn::PushObjectCache
                                      ((CdnPushObjectCacheRequestType *)this,
                                       (CdnPushObjectCacheResponseType *)&req,(CdnErrorInfo *)&req_2
                                      );
                            HttpTestListener::WaitComplete(this_00);
                          }
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_208,"127.0.0.1:12234",
                                     (allocator<char> *)&local_268);
                          aliyun::Cdn::SetProxyHost((Cdn *)this,&local_208);
                          std::__cxx11::string::~string((string *)&local_208);
                          if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                            *(undefined1 *)
                             ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                          }
                          this_00 = (HttpTestListener *)operator_new(0x180);
                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_268,"{}",&local_289);
                          HttpTestListener::SetResponseBody(this_00,&local_268);
                          std::__cxx11::string::~string((string *)&local_268);
                          HttpTestListener::Start(this_00);
                          std::__cxx11::string::assign((char *)&req);
                          std::__cxx11::string::assign((char *)&req.resource_owner_account);
                          std::__cxx11::string::assign((char *)&req.resource_owner_id);
                          std::__cxx11::string::assign((char *)&req.domain_name);
                          aliyun::Cdn::OpenCdnService
                                    ((CdnOpenCdnServiceRequestType *)this,
                                     (CdnOpenCdnServiceResponseType *)&req,(CdnErrorInfo *)&resp);
                          HttpTestListener::WaitComplete(this_00);
                        }
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_208,"127.0.0.1:12234",
                                   (allocator<char> *)&local_268);
                        aliyun::Cdn::SetProxyHost((Cdn *)this,&local_208);
                        std::__cxx11::string::~string((string *)&local_208);
                        if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                          *(undefined1 *)
                           ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                        }
                        this_00 = (HttpTestListener *)operator_new(0x180);
                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,"{}",&local_289);
                        HttpTestListener::SetResponseBody(this_00,&local_268);
                        std::__cxx11::string::~string((string *)&local_268);
                        HttpTestListener::Start(this_00);
                        std::__cxx11::string::assign((char *)&req);
                        std::__cxx11::string::assign((char *)&req.resource_owner_account);
                        std::__cxx11::string::assign((char *)&req.resource_owner_id);
                        std::__cxx11::string::assign((char *)&req.domain_name);
                        aliyun::Cdn::ModifyCdnService
                                  ((CdnModifyCdnServiceRequestType *)this,
                                   (CdnModifyCdnServiceResponseType *)&req,(CdnErrorInfo *)&resp);
                        HttpTestListener::WaitComplete(this_00);
                      }
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
                      aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
                      std::__cxx11::string::~string((string *)&local_268);
                      if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1)
                             = 0;
                      }
                      this_00 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp,
                                 "{  \"Domains\": {    \"PageData\": [      {        \"DomainName\": \"DomainName\",        \"Cname\": \"Cname\",        \"CdnType\": \"CdnType\",        \"DomainStatus\": \"DomainStatus\",        \"GmtCreated\": \"GmtCreated\",        \"GmtModified\": \"GmtModified\"      }    ]  },  \"PageNumber\": 0,  \"PageSize\": 0,  \"TotalCount\": 0}"
                                 ,&local_289);
                      HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                      std::__cxx11::string::~string((string *)&resp);
                      HttpTestListener::Start(this_00);
                      std::__cxx11::string::assign((char *)&req);
                      std::__cxx11::string::assign((char *)&req.resource_owner_account);
                      std::__cxx11::string::assign((char *)&req.resource_owner_id);
                      std::__cxx11::string::assign((char *)&req.domain_name);
                      std::__cxx11::string::assign((char *)&req.ssl_flag);
                      aliyun::Cdn::DescribeUserDomains
                                ((CdnDescribeUserDomainsRequestType *)this,
                                 (CdnDescribeUserDomainsResponseType *)&req,(CdnErrorInfo *)&req_2);
                      HttpTestListener::WaitComplete(this_00);
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
                    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
                    std::__cxx11::string::~string((string *)&local_268);
                    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) =
                           0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp,
                               "{  \"Tasks\": {    \"CDNTask\": [      {        \"TaskId\": \"TaskId\",        \"ObjectPath\": \"ObjectPath\",        \"Status\": \"Status\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"PageNumber\": 0,  \"PageSize\": 0,  \"TotalCount\": 0}"
                               ,&local_289);
                    HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                    std::__cxx11::string::~string((string *)&resp);
                    HttpTestListener::Start(this_00);
                    std::__cxx11::string::assign((char *)&req);
                    std::__cxx11::string::assign((char *)&req.resource_owner_account);
                    std::__cxx11::string::assign((char *)&req.resource_owner_id);
                    std::__cxx11::string::assign((char *)&req.domain_name);
                    std::__cxx11::string::assign((char *)&req.ssl_flag);
                    std::__cxx11::string::assign((char *)&req.source_type);
                    std::__cxx11::string::assign((char *)&req.cdn_type);
                    aliyun::Cdn::DescribeRefreshTasks
                              ((CdnDescribeRefreshTasksRequestType *)this,
                               (CdnDescribeRefreshTasksResponseType *)&req,(CdnErrorInfo *)&req_2);
                    HttpTestListener::WaitComplete(this_00);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
                  aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
                  std::__cxx11::string::~string((string *)&local_268);
                  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,"{  \"Bps\": \"Bps\",  \"Qps\": \"Qps\"}",&local_289);
                  HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                  std::__cxx11::string::~string((string *)&resp);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&req.resource_owner_account);
                  std::__cxx11::string::assign((char *)&req.resource_owner_id);
                  std::__cxx11::string::assign((char *)&req.domain_name);
                  std::__cxx11::string::assign((char *)&req.ssl_flag);
                  aliyun::Cdn::DescribeOneMinuteData
                            ((CdnDescribeOneMinuteDataRequestType *)this,
                             (CdnDescribeOneMinuteDataResponseType *)&req,(CdnErrorInfo *)&req_2);
                  HttpTestListener::WaitComplete(this_00);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
                aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
                std::__cxx11::string::~string((string *)&local_268);
                if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&resp,
                           "{  \"OperationLocks\": {    \"LockReason\": [      {        \"LockReason\": \"LockReason\"      }    ]  },  \"InternetChargeType\": \"InternetChargeType\",  \"OpeningTime\": \"OpeningTime\",  \"ChangingChargeType\": \"ChangingChargeType\",  \"ChangingAffectTime\": \"ChangingAffectTime\"}"
                           ,&local_289);
                HttpTestListener::SetResponseBody(this_00,(string *)&resp);
                std::__cxx11::string::~string((string *)&resp);
                HttpTestListener::Start(this_00);
                std::__cxx11::string::assign((char *)&req_2);
                std::__cxx11::string::assign((char *)&req_2.resource_owner_account);
                std::__cxx11::string::assign((char *)&req_2.resource_owner_id);
                aliyun::Cdn::DescribeCdnService
                          ((CdnDescribeCdnServiceRequestType *)this,
                           (CdnDescribeCdnServiceResponseType *)&req_2,(CdnErrorInfo *)&req);
                HttpTestListener::WaitComplete(this_00);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
              aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
              std::__cxx11::string::~string((string *)&local_268);
              if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
              }
              this_00 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(this_00,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&resp,
                         "{  \"MonitorDatas\": {    \"CDNMonitorData\": [      {        \"TimeStamp\": \"TimeStamp\",        \"QueryPerSecond\": \"QueryPerSecond\",        \"BytesPerSecond\": \"BytesPerSecond\",        \"BytesHitRate\": \"BytesHitRate\",        \"RequestHitRate\": \"RequestHitRate\",        \"AverageObjectSize\": \"AverageObjectSize\"      }    ]  },  \"DomainName\": \"DomainName\",  \"MonitorInterval\": 0,  \"StartTime\": \"StartTime\",  \"EndTime\": \"EndTime\"}"
                         ,&local_289);
              HttpTestListener::SetResponseBody(this_00,(string *)&resp);
              std::__cxx11::string::~string((string *)&resp);
              HttpTestListener::Start(this_00);
              std::__cxx11::string::assign((char *)&req);
              std::__cxx11::string::assign((char *)&req.resource_owner_account);
              std::__cxx11::string::assign((char *)&req.resource_owner_id);
              std::__cxx11::string::assign((char *)&req.domain_name);
              std::__cxx11::string::assign((char *)&req.ssl_flag);
              std::__cxx11::string::assign((char *)&req.source_type);
              aliyun::Cdn::DescribeCdnMonitorData
                        ((CdnDescribeCdnMonitorDataRequestType *)this,
                         (CdnDescribeCdnMonitorDataResponseType *)&req,(CdnErrorInfo *)&req_2);
              HttpTestListener::WaitComplete(this_00);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
            aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
            std::__cxx11::string::~string((string *)&local_268);
            if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
              *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
            }
            this_00 = (HttpTestListener *)operator_new(0x180);
            HttpTestListener::HttpTestListener(this_00,0x2fca);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&resp,
                       "{  \"DomainLogModel\": {    \"DomainLogDetails\": {      \"DomainLogDetail\": [        {          \"LogName\": \"LogName\",          \"LogPath\": \"LogPath\",          \"LogSize\": 0,          \"StartTime\": \"StartTime\",          \"EndTime\": \"EndTime\"        }      ]    },    \"DomainName\": \"DomainName\"  }}"
                       ,&local_289);
            HttpTestListener::SetResponseBody(this_00,(string *)&resp);
            std::__cxx11::string::~string((string *)&resp);
            HttpTestListener::Start(this_00);
            std::__cxx11::string::assign((char *)&req);
            std::__cxx11::string::assign((char *)&req.resource_owner_account);
            std::__cxx11::string::assign((char *)&req.resource_owner_id);
            std::__cxx11::string::assign((char *)&req.domain_name);
            std::__cxx11::string::assign((char *)&req.ssl_flag);
            aliyun::Cdn::DescribeCdnDomainLogs
                      ((CdnDescribeCdnDomainLogsRequestType *)this,
                       (CdnDescribeCdnDomainLogsResponseType *)&req,(CdnErrorInfo *)&req_2);
            HttpTestListener::WaitComplete(this_00);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
          aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
            *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
          }
          this_00 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(this_00,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resp,
                     "{  \"GetDomainDetailModel\": {    \"Sources\": {      \"Source\": [        \"Source\"      ]    },    \"GmtCreated\": \"GmtCreated\",    \"GmtModified\": \"GmtModified\",    \"SourceType\": \"SourceType\",    \"DomainStatus\": \"DomainStatus\",    \"CdnType\": \"CdnType\",    \"Cname\": \"Cname\",    \"HttpsCname\": \"HttpsCname\",    \"DomainName\": \"DomainName\",    \"Remark\": \"Remark\"  }}"
                     ,&local_289);
          HttpTestListener::SetResponseBody(this_00,(string *)&resp);
          std::__cxx11::string::~string((string *)&resp);
          HttpTestListener::Start(this_00);
          std::__cxx11::string::assign((char *)&req_2);
          std::__cxx11::string::assign((char *)&req_2.resource_owner_account);
          std::__cxx11::string::assign((char *)&req_2.resource_owner_id);
          std::__cxx11::string::assign((char *)&req_2.domain_name);
          aliyun::Cdn::DescribeCdnDomainDetail
                    ((CdnDescribeCdnDomainDetailRequestType *)this,
                     (CdnDescribeCdnDomainDetailResponseType *)&req_2,(CdnErrorInfo *)&req);
          HttpTestListener::WaitComplete(this_00);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)&resp);
        aliyun::Cdn::SetProxyHost((Cdn *)this,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resp,
                   "{  \"DomainBaseDetailModel\": {    \"Sources\": {      \"Source\": [        \"Source\"      ]    },    \"Cname\": \"Cname\",    \"CdnType\": \"CdnType\",    \"DomainStatus\": \"DomainStatus\",    \"SourceType\": \"SourceType\",    \"DomainName\": \"DomainName\",    \"Remark\": \"Remark\",    \"GmtModified\": \"GmtModified\",    \"GmtCreated\": \"GmtCreated\"  }}"
                   ,&local_289);
        HttpTestListener::SetResponseBody(this_00,(string *)&resp);
        std::__cxx11::string::~string((string *)&resp);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req_2);
        std::__cxx11::string::assign((char *)&req_2.resource_owner_account);
        std::__cxx11::string::assign((char *)&req_2.resource_owner_id);
        std::__cxx11::string::assign((char *)&req_2.domain_name);
        aliyun::Cdn::DescribeCdnDomainBaseDetail
                  ((CdnDescribeCdnDomainBaseDetailRequestType *)this,
                   (CdnDescribeCdnDomainBaseDetailResponseType *)&req_2,(CdnErrorInfo *)&req);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"127.0.0.1:12234",(allocator<char> *)&local_268);
      aliyun::Cdn::SetProxyHost((Cdn *)this,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"{}",&local_289);
      HttpTestListener::SetResponseBody(this_00,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.resource_owner_account);
      std::__cxx11::string::assign((char *)&req.resource_owner_id);
      std::__cxx11::string::assign((char *)&req.domain_name);
      aliyun::Cdn::DeleteCdnDomain
                ((CdnDeleteCdnDomainRequestType *)this,(CdnDeleteCdnDomainResponseType *)&req,
                 (CdnErrorInfo *)&resp);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"127.0.0.1:12234",(allocator<char> *)&local_268);
    aliyun::Cdn::SetProxyHost((Cdn *)this,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"{}",&local_289);
    HttpTestListener::SetResponseBody(this_00,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.resource_owner_account);
    std::__cxx11::string::assign((char *)&req.resource_owner_id);
    std::__cxx11::string::assign((char *)&req.domain_name);
    std::__cxx11::string::assign((char *)&req.ssl_flag);
    std::__cxx11::string::assign((char *)&req.source_type);
    std::__cxx11::string::assign((char *)&req.cdn_type);
    std::__cxx11::string::assign((char *)&req.sources);
    aliyun::Cdn::AddCdnDomain(this,(CdnAddCdnDomainResponseType *)&req,(CdnErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::Cdn::~Cdn((Cdn *)this);
  operator_delete(this,0x38);
  aliyun::CdnAddCdnDomainRequestType::~CdnAddCdnDomainRequestType(&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_add_cdn_domain();
  test_delete_cdn_domain();
  test_describe_cdn_domain_base_detail();
  test_describe_cdn_domain_detail();
  test_describe_cdn_domain_logs();
  test_describe_cdn_monitor_data();
  test_describe_cdn_service();
  test_describe_one_minute_data();
  test_describe_refresh_tasks();
  test_describe_user_domains();
  test_modify_cdn_service();
  test_open_cdn_service();
  test_push_object_cache();
  test_refresh_object_caches();
  test_start_cdn_domain();
  test_stop_cdn_domain();
}